

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::RunCheckForUnusedVariables(cmake *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  ostringstream msg;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1d8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Manually-specified variables were not used by the project:",0x3a)
  ;
  p_Var2 = (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    bVar3 = false;
    do {
      while ((char)p_Var2[2]._M_color == _S_red) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n  ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
        bVar3 = true;
        if ((_Rb_tree_header *)p_Var2 == p_Var1) goto LAB_0030cf9a;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
    if (bVar3) {
LAB_0030cf9a:
      std::__cxx11::stringbuf::str();
      local_1d8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_1d8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1d8);
      cmMessenger::IssueMessage
                ((this->Messenger)._M_t.
                 super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                 super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                 super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,WARNING,&local_1c8,
                 (cmListFileBacktrace *)&local_1d8);
      if (local_1d8.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1d8.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void cmake::RunCheckForUnusedVariables()
{
#ifndef CMAKE_BOOTSTRAP
  bool haveUnused = false;
  std::ostringstream msg;
  msg << "Manually-specified variables were not used by the project:";
  for (auto const& it : this->UsedCliVariables) {
    if (!it.second) {
      haveUnused = true;
      msg << "\n  " << it.first;
    }
  }
  if (haveUnused) {
    this->IssueMessage(MessageType::WARNING, msg.str());
  }
#endif
}